

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidatePushCData(xmlValidCtxtPtr ctxt,xmlChar *data,int len)

{
  xmlElementTypeVal xVar1;
  xmlValidState *pxVar2;
  char *msg;
  xmlParserErrors error;
  ulong uVar3;
  xmlNodePtr node;
  xmlChar *str1;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  if ((((0 < len) && (0 < ctxt->vstateNr)) &&
      (pxVar2 = ctxt->vstate, pxVar2 != (xmlValidState *)0x0)) &&
     (pxVar2->elemDecl != (xmlElementPtr)0x0)) {
    xVar1 = pxVar2->elemDecl->etype;
    if (xVar1 == XML_ELEMENT_TYPE_UNDEFINED) {
      return 0;
    }
    if (xVar1 == XML_ELEMENT_TYPE_EMPTY) {
      node = pxVar2->node;
      str1 = node->name;
      msg = "Element %s was declared EMPTY this one has content\n";
      error = XML_DTD_NOT_EMPTY;
LAB_00192025:
      xmlErrValidNode(ctxt,node,error,msg,str1,(xmlChar *)0x0,(xmlChar *)0x0);
      return 0;
    }
    if (xVar1 == XML_ELEMENT_TYPE_ELEMENT) {
      uVar3 = 0;
      do {
        if ((0x20 < (ulong)data[uVar3]) || ((0x100002600U >> ((ulong)data[uVar3] & 0x3f) & 1) == 0))
        {
          node = pxVar2->node;
          str1 = node->name;
          msg = "Element %s content does not follow the DTD, Text not allowed\n";
          error = XML_DTD_CONTENT_MODEL;
          goto LAB_00192025;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)len != uVar3);
    }
  }
  return 1;
}

Assistant:

int
xmlValidatePushCData(xmlValidCtxtPtr ctxt, const xmlChar *data, int len) {
    int ret = 1;

/* printf("CDATA %s %d\n", data, len); */
    if (ctxt == NULL)
        return(0);
    if (len <= 0)
	return(ret);
    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    break;
		case XML_ELEMENT_TYPE_ELEMENT: {
                    int i;

                    for (i = 0;i < len;i++) {
                        if (!IS_BLANK_CH(data[i])) {
                            xmlErrValidNode(ctxt, state->node,
                                            XML_DTD_CONTENT_MODEL,
       "Element %s content does not follow the DTD, Text not allowed\n",
                                   state->node->name, NULL, NULL);
                            ret = 0;
                            goto done;
                        }
                    }
                    /*
                     * TODO:
                     * VC: Standalone Document Declaration
                     *  element types with element content, if white space
                     *  occurs directly within any instance of those types.
                     */
                    break;
                }
	    }
	}
    }
done:
    return(ret);
}